

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# droplayer.cpp
# Opt level: O0

UINT32 __thiscall DROPlayer::GetCurPos(DROPlayer *this,UINT8 unit)

{
  UINT8 unit_local;
  DROPlayer *this_local;
  
  switch(unit) {
  case '\0':
    this_local._4_4_ = this->_filePos;
    break;
  case '\x01':
    this_local._4_4_ = this->_playTick;
    break;
  case '\x02':
    this_local._4_4_ = this->_playSmpl;
    break;
  case '\x03':
  default:
    this_local._4_4_ = 0xffffffff;
  }
  return this_local._4_4_;
}

Assistant:

UINT32 DROPlayer::GetCurPos(UINT8 unit) const
{
	switch(unit)
	{
	case PLAYPOS_FILEOFS:
		return _filePos;
	case PLAYPOS_TICK:
		return _playTick;
	case PLAYPOS_SAMPLE:
		return _playSmpl;
	case PLAYPOS_COMMAND:
	default:
		return (UINT32)-1;
	}
}